

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::damage(Entity *this,int points)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar1 = this->health - points;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  this->health = iVar3;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  poVar2 = std::operator<<(poVar2," damaged to ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->health);
  poVar2 = std::operator<<(poVar2,"health");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Entity::damage(int points)
{
  health = std::max(0, health - points);
  std::cout << name << " damaged to " << health << "health" << std::endl;
}